

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ures.h
# Opt level: O0

UnicodeString *
icu_63::ures_getNextUnicodeString
          (UnicodeString *__return_storage_ptr__,UResourceBundle *resB,char **key,UErrorCode *status
          )

{
  UBool UVar1;
  ConstChar16Ptr local_50 [3];
  char16_t *local_38;
  UChar *r;
  int32_t len;
  UErrorCode *status_local;
  char **key_local;
  UResourceBundle *resB_local;
  UnicodeString *result;
  
  r._7_1_ = 0;
  _len = status;
  status_local = (UErrorCode *)key;
  key_local = &resB->fKey;
  resB_local = (UResourceBundle *)__return_storage_ptr__;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  r._0_4_ = 0;
  local_38 = ures_getNextString_63
                       ((UResourceBundle *)key_local,(int32_t *)&r,(char **)status_local,_len);
  UVar1 = ::U_SUCCESS(*_len);
  if (UVar1 == '\0') {
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr(local_50,local_38);
    UnicodeString::setTo(__return_storage_ptr__,'\x01',local_50,(int32_t)r);
    ConstChar16Ptr::~ConstChar16Ptr(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline UnicodeString
ures_getNextUnicodeString(UResourceBundle *resB, const char ** key, UErrorCode* status) {
    UnicodeString result;
    int32_t len = 0;
    const UChar* r = ures_getNextString(resB, &len, key, status);
    if(U_SUCCESS(*status)) {
        result.setTo(TRUE, r, len);
    } else {
        result.setToBogus();
    }
    return result;
}